

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O2

void __thiscall
Js::LocalsWalker::ExpandArgumentsObject
          (LocalsWalker *this,IDiagObjectModelDisplay *argumentsDisplay)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  IDiagObjectModelWalkerBase *pIVar6;
  uint uVar7;
  undefined4 local_70 [2];
  ResolvedObject tempResolvedObj;
  WeakArenaReference<Js::IDiagObjectModelWalkerBase> *this_00;
  
  if (argumentsDisplay == (IDiagObjectModelDisplay *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x635,"(argumentsDisplay != nullptr)","argumentsDisplay != nullptr"
                               );
    if (!bVar2) goto LAB_007e97b8;
    *puVar5 = 0;
  }
  iVar3 = (*argumentsDisplay->_vptr_IDiagObjectModelDisplay[7])(argumentsDisplay);
  this_00 = (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)CONCAT44(extraout_var,iVar3);
  if (this_00 == (WeakArenaReference<Js::IDiagObjectModelWalkerBase> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x638,"(argumentsObjectWalkerRef != nullptr)",
                                "argumentsObjectWalkerRef != nullptr");
    if (!bVar2) {
LAB_007e97b8:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  pIVar6 = Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::GetStrongReference(this_00);
  uVar4 = (*pIVar6->_vptr_IDiagObjectModelWalkerBase[1])(pIVar6);
  local_70[0] = 0xffffffff;
  tempResolvedObj.name._4_1_ = 0;
  tempResolvedObj.propId = 0;
  tempResolvedObj._4_4_ = 0;
  tempResolvedObj.scriptContext = (ScriptContext *)0x0;
  tempResolvedObj.address = (IDiagObjectAddress *)0x0;
  tempResolvedObj.objectDisplay = (IDiagObjectModelDisplay *)0x0;
  tempResolvedObj.obj = (Var)0x0;
  tempResolvedObj.originalObj = (Var)0x0;
  uVar7 = 0;
  if ((int)uVar4 < 1) {
    uVar4 = 0;
    uVar7 = 0;
  }
  for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
    (**pIVar6->_vptr_IDiagObjectModelWalkerBase)(pIVar6,(ulong)uVar7,local_70);
  }
  Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::ReleaseStrongReference(this_00);
  Memory::
  DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>>
            (&Memory::HeapAllocator::Instance,this_00);
  return;
}

Assistant:

void LocalsWalker::ExpandArgumentsObject(IDiagObjectModelDisplay * argumentsDisplay)
    {
        Assert(argumentsDisplay != nullptr);

        WeakArenaReference<Js::IDiagObjectModelWalkerBase>* argumentsObjectWalkerRef = argumentsDisplay->CreateWalker();
        Assert(argumentsObjectWalkerRef != nullptr);

        IDiagObjectModelWalkerBase * walker = argumentsObjectWalkerRef->GetStrongReference();
        int count = (int)walker->GetChildrenCount();
        Js::ResolvedObject tempResolvedObj;
        for (int i = 0; i < count; i++)
        {
            walker->Get(i, &tempResolvedObj);
        }
        argumentsObjectWalkerRef->ReleaseStrongReference();
        HeapDelete(argumentsObjectWalkerRef);
    }